

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O2

int __thiscall
connector::server<(connector::CONNECTOR_TYPE)0>::init
          (server<(connector::CONNECTOR_TYPE)0> *this,EVP_PKEY_CTX *ctx)

{
  ushort uVar1;
  int iVar2;
  ostream *poVar3;
  
  iVar2 = socket(2,1,0);
  this->_listen_socket = iVar2;
  poVar3 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
  poVar3 = std::operator<<(poVar3,"server.h");
  poVar3 = std::operator<<(poVar3,':');
  if (iVar2 == -1) {
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3f);
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = std::operator<<(poVar3,"init");
    poVar3 = std::operator<<(poVar3,"()]: ");
    std::operator<<(poVar3,"Error creating socket with -1\n");
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x42);
    poVar3 = std::operator<<(poVar3,':');
    poVar3 = std::operator<<(poVar3,"init");
    poVar3 = std::operator<<(poVar3,"()]: ");
    std::operator<<(poVar3,"Created socket!\n");
    (this->_ourAddr).sin_family = 2;
    (this->_ourAddr).sin_addr.s_addr = 0;
    uVar1 = (ushort)this->_port;
    (this->_ourAddr).sin_port = uVar1 << 8 | uVar1 >> 8;
    iVar2 = bind(this->_listen_socket,(sockaddr *)this,0x10);
    this->_bnd = iVar2;
    poVar3 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
    poVar3 = std::operator<<(poVar3,"server.h");
    poVar3 = std::operator<<(poVar3,':');
    if (iVar2 < 0) {
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4b);
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = std::operator<<(poVar3,"init");
      poVar3 = std::operator<<(poVar3,"()]: ");
      poVar3 = std::operator<<(poVar3,"Error binding with error: ");
      iVar2 = this->_bnd;
    }
    else {
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4e);
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = std::operator<<(poVar3,"init");
      poVar3 = std::operator<<(poVar3,"()]: ");
      poVar3 = std::operator<<(poVar3,"Binding successful to port ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_port);
      std::operator<<(poVar3,"!\n");
      listen(this->_listen_socket,1);
      this->_len = 0x10;
      iVar2 = accept(this->_listen_socket,(sockaddr *)&this->_cliAddr,&this->_len);
      this->_skt = iVar2;
      poVar3 = std::operator<<((ostream *)&std::cerr,"[CONNECTOR - ");
      poVar3 = std::operator<<(poVar3,"server.h");
      poVar3 = std::operator<<(poVar3,':');
      if (-1 < iVar2) {
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5b);
        poVar3 = std::operator<<(poVar3,':');
        poVar3 = std::operator<<(poVar3,"init");
        poVar3 = std::operator<<(poVar3,"()]: ");
        poVar3 = std::operator<<(poVar3,"All clients (");
        poVar3 = std::operator<<(poVar3,"1");
        std::operator<<(poVar3,") connected!\n");
        return this->_skt;
      }
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x56);
      poVar3 = std::operator<<(poVar3,':');
      poVar3 = std::operator<<(poVar3,"init");
      poVar3 = std::operator<<(poVar3,"()]: ");
      poVar3 = std::operator<<(poVar3,"Connection accept failed with error: ");
      iVar2 = this->_skt;
    }
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,'\n');
  }
  return -1;
}

Assistant:

int init( ) {
        // creating socket
        _listen_socket = socket( AF_INET, SOCK_STREAM, 0 );
        if ( _listen_socket == -1 ) {
            DEBUG_CRIT_MSG_CONNECTOR( "Error creating socket with -1\n" );
            return -1;
        } else {
            DEBUG_MSG_CONNECTOR( "Created socket!\n" );
        }

        // binding port
        _ourAddr.sin_family      = AF_INET;
        _ourAddr.sin_addr.s_addr = INADDR_ANY;
        _ourAddr.sin_port        = htons( _port );
        _bnd = bind( _listen_socket, (struct sockaddr *)&_ourAddr, sizeof( _ourAddr ) );
        if ( _bnd < 0 ) {
            DEBUG_CRIT_MSG_CONNECTOR( "Error binding with error: " << _bnd << '\n' );
            return -1;
        } else {
            DEBUG_MSG_CONNECTOR( "Binding successful to port " << _port << "!\n" );
        }

        // waiting for _skt clients to connect (blocking)
        listen( _listen_socket, 1 );
        _len = sizeof( struct sockaddr_in );
        _skt = accept( _listen_socket, (struct sockaddr *)&_cliAddr, (socklen_t *)&_len );
        if ( _skt < 0 ) {
            DEBUG_CRIT_MSG_CONNECTOR( "Connection accept failed with error: " << _skt << '\n');
            return -1;
        } else {
            DEBUG_MSG_CONNECTOR( "All clients ("
                                << "1"
                                << ") connected!\n" );
        }
        return _skt;
    }